

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFromObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *field;
  int i;
  string local_48;
  Descriptor *local_28;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = desc;
  desc_local = (Descriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "if (jspb.Message.GENERATE_FROM_OBJECT) {\n/**\n * Loads data from an object into a new instance of this proto.\n * @param {!Object} obj The object representation of this proto to\n *     load the data from.\n * @return {!$classname$}\n */\n$classname$.fromObject = function(obj) {\n  var f, msg = new $classname$();\n"
                     ,"classname",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  field._0_4_ = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(local_28);
    if (iVar1 <= (int)field) break;
    field_00 = Descriptor::field(local_28,(int)field);
    GenerateClassFieldFromObject
              (this,(GeneratorOptions *)printer_local,(Printer *)desc_local,field_00);
    field._0_4_ = (int)field + 1;
  }
  io::Printer::Print((Printer *)desc_local,"  return msg;\n};\n}\n");
  return;
}

Assistant:

void Generator::GenerateClassFromObject(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const Descriptor* desc) const {
  printer->Print(
      "if (jspb.Message.GENERATE_FROM_OBJECT) {\n"
      "/**\n"
      " * Loads data from an object into a new instance of this proto.\n"
      " * @param {!Object} obj The object representation of this proto to\n"
      " *     load the data from.\n"
      " * @return {!$classname$}\n"
      " */\n"
      "$classname$.fromObject = function(obj) {\n"
      "  var f, msg = new $classname$();\n",
      "classname", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    GenerateClassFieldFromObject(options, printer, field);
  }

  printer->Print(
      "  return msg;\n"
      "};\n"
      "}\n");
}